

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O3

int GetCharConstAsString<unsigned_char>(char **p,uchar *e,int *ei,int max_ei,int add)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  aint val;
  aint local_3c;
  char *local_38;
  
  local_38 = *p;
  if ((*local_38 != '\'') && (*local_38 != '\"')) {
    return 0;
  }
  pcVar3 = local_38 + 1;
  *p = pcVar3;
  cVar1 = *local_38;
  iVar2 = *ei;
  if (iVar2 < max_ei) {
    do {
      if (cVar1 == '\"') {
        iVar2 = GetCharConstInDoubleQuotes(p,&local_3c);
        if (iVar2 == 0) break;
        iVar2 = *ei;
      }
      else {
        pcVar3 = *p;
        if (*pcVar3 == '\'') {
          if (pcVar3[1] != '\'') break;
          local_3c = 0x27;
          *p = pcVar3 + 2;
        }
        else {
          if (*pcVar3 == '\0') break;
          *p = pcVar3 + 1;
          local_3c = (aint)*pcVar3;
        }
      }
      *ei = iVar2 + 1;
      e[iVar2] = (char)local_3c + (char)add;
      iVar2 = *ei;
    } while (iVar2 < max_ei);
    pcVar3 = *p;
  }
  if ((uint)(cVar1 != '\"') * 5 + 0x22 == (int)*pcVar3) {
    *p = pcVar3 + 1;
    if (pcVar3[1] == 'C') {
      *p = pcVar3 + 2;
      if ((long)*ei == 0) goto LAB_00125c27;
      e[(long)*ei + -1] = e[(long)*ei + -1] | 0x80;
    }
    else if (pcVar3[1] == 'Z') {
      iVar2 = *ei;
      if (max_ei <= iVar2) {
        return -2;
      }
      *p = pcVar3 + 2;
      *ei = iVar2 + 1;
      e[iVar2] = '\0';
    }
    iVar2 = (cVar1 == '\"') + 1;
  }
  else {
    if (*pcVar3 != '\0') {
      return -2;
    }
    Error("Syntax error",local_38,SUPPRESS);
LAB_00125c27:
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int GetCharConstAsString(char* & p, strT e[], int & ei, int max_ei, int add) {
	if ('"' != *p && '\'' != *p) return 0;
	const char* const elementP = p;
	const bool quotes = ('"' == *p++);
	aint val;
	while (ei < max_ei && (quotes ? GetCharConstInDoubleQuotes(p, val) : GetCharConstInApostrophes(p, val))) {
		e[ei++] = (val + add) & 255;
	}
	if ((quotes ? '"' : '\'') != *p) {	// too many/invalid arguments or zero-terminator can lead to this
		if (*p) return -2;				// too many arguments
		Error("Syntax error", elementP, SUPPRESS);	// zero-terminator
		return -1;
	}
	++p;
	if ('Z' == *p) {
		if (max_ei <= ei) return -2;	// no space for zero byte (keep p pointing at Z to report error)
		++p;
		e[ei++] = 0;
	} else if ('C' == *p) {
		++p;
		if (0 == ei) return -1;			// empty string can't have last char patched
		e[ei - 1] |= 0x80;
	}
	return 1 + quotes;
}